

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O1

vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
* __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::uncovered
          (vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
           *__return_storage_ptr__,DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          IntervalT *I)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  const_iterator cVar3;
  pointer pDVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  ret;
  IntervalT cur;
  pointer local_78;
  iterator iStack_70;
  pointer local_68;
  DiscreteInterval<dg::Offset> local_58;
  DiscreteInterval<dg::Offset> local_48;
  vector<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  *local_38;
  
  if ((this->_mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
LAB_00114932:
    local_78 = (pointer)(I->start).offset;
    iStack_70._M_current = (DiscreteInterval<dg::Offset> *)(I->end).offset;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pDVar4 = (pointer)operator_new(0x10);
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_start = pDVar4;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar4 + 1;
    (pDVar4->start).offset = (type)local_78;
    (pDVar4->end).offset = (type)iStack_70._M_current;
    (__return_storage_ptr__->
    super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pDVar4 + 1;
    return __return_storage_ptr__;
  }
  cVar3 = le(this,I);
  p_Var7 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar3._M_node == p_Var7) goto LAB_00114932;
  local_78 = (pointer)0x0;
  iStack_70._M_current = (DiscreteInterval<dg::Offset> *)0x0;
  local_68 = (pointer)0x0;
  local_58.start.offset = (I->start).offset;
  local_58.end.offset = (I->end).offset;
  if (*(_Base_ptr *)(cVar3._M_node + 1) < local_58.start.offset) {
    p_Var1 = cVar3._M_node[1]._M_parent;
    if ((_Base_ptr)(I->end).offset <= p_Var1) {
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      goto LAB_00114a77;
    }
    p_Var5 = (_Base_ptr)((long)&p_Var1->_M_color + 1);
    if ((_Base_ptr)((long)&Offset::UNKNOWN[-1]._M_right + 7U) <= p_Var1) {
      p_Var5 = Offset::UNKNOWN;
    }
    if (p_Var1 == Offset::UNKNOWN) {
      p_Var5 = Offset::UNKNOWN;
    }
    local_58.start.offset = (type)p_Var5;
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
    if (((_Rb_tree_header *)cVar3._M_node == p_Var7) && (p_Var5 <= local_58.end.offset)) {
      local_48.start.offset = local_58.start.offset;
      local_48.end.offset = local_58.end.offset;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pDVar4 = (pointer)operator_new(0x10);
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_start = pDVar4;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = pDVar4 + 1;
      (pDVar4->start).offset = local_48.start.offset;
      (pDVar4->end).offset = local_48.end.offset;
      (__return_storage_ptr__->
      super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pDVar4 + 1;
      goto LAB_00114a77;
    }
  }
  p_Var5 = Offset::UNKNOWN;
  p_Var1 = Offset::UNKNOWN + -1;
  local_38 = __return_storage_ptr__;
  do {
    p_Var2 = *(_Base_ptr *)(cVar3._M_node + 1);
    if (local_58.start.offset < p_Var2) {
      local_48.end.offset = (type)((long)&p_Var2[-1]._M_right + 7);
      if (p_Var5 == (_Base_ptr)0x1) {
        local_48.end.offset = (type)p_Var5;
      }
      if (p_Var2 == p_Var5) {
        local_48.end.offset = (type)p_Var5;
      }
      local_48.start.offset = local_58.start.offset;
      if (iStack_70._M_current == local_68) {
        std::
        vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
        ::_M_realloc_insert<dg::ADT::DiscreteInterval<dg::Offset>>
                  ((vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
                    *)&local_78,iStack_70,&local_48);
      }
      else {
        ((iStack_70._M_current)->start).offset = local_58.start.offset;
        ((iStack_70._M_current)->end).offset = local_48.end.offset;
        iStack_70._M_current = iStack_70._M_current + 1;
      }
    }
    p_Var2 = cVar3._M_node[1]._M_parent;
    if ((_Base_ptr)(I->end).offset <= p_Var2) goto LAB_00114a50;
    p_Var6 = (_Base_ptr)((long)&p_Var2->_M_color + 1);
    if ((_Base_ptr)((long)&p_Var1->_M_right + 7U) <= p_Var2) {
      p_Var6 = p_Var5;
    }
    if (p_Var2 == p_Var5) {
      p_Var6 = p_Var5;
    }
    local_58.start.offset = (type)p_Var6;
    cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
  } while ((_Rb_tree_header *)cVar3._M_node != p_Var7);
  if (p_Var6 <= local_58.end.offset) {
    if (iStack_70._M_current == local_68) {
      std::
      vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
      ::_M_realloc_insert<dg::ADT::DiscreteInterval<dg::Offset>const&>
                ((vector<dg::ADT::DiscreteInterval<dg::Offset>,std::allocator<dg::ADT::DiscreteInterval<dg::Offset>>>
                  *)&local_78,iStack_70,&local_58);
    }
    else {
      ((iStack_70._M_current)->start).offset = local_58.start.offset;
      ((iStack_70._M_current)->end).offset = local_58.end.offset;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
  }
LAB_00114a50:
  (local_38->
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  )._M_impl.super__Vector_impl_data._M_start = local_78;
  (local_38->
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = iStack_70._M_current;
  (local_38->
  super__Vector_base<dg::ADT::DiscreteInterval<dg::Offset>,_std::allocator<dg::ADT::DiscreteInterval<dg::Offset>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
  local_78 = (pointer)0x0;
  iStack_70._M_current = (DiscreteInterval<dg::Offset> *)0x0;
  local_68 = (pointer)0x0;
  __return_storage_ptr__ = local_38;
LAB_00114a77:
  if (local_78 == (pointer)0x0) {
    return __return_storage_ptr__;
  }
  operator_delete(local_78,(long)local_68 - (long)local_78);
  return __return_storage_ptr__;
}

Assistant:

std::vector<IntervalT> uncovered(const IntervalT &I) const {
        if (_mapping.empty())
            return {I};

        auto it = le(I);
        if (it == end())
            return {I};

        std::vector<IntervalT> ret;
        IntervalT cur = I;

        if (cur.start > it->first.start) {
            // the first interval covers the whole I?
            if (it->first.end >= I.end) {
                return {};
            }

            assert(cur == I);
            cur.start = it->first.end + 1;
            assert(cur.end == I.end);
            assert(I.end > it->first.end);
            // we handled this interval, move further
            ++it;

            // nothing else to handle...
            if (it == _mapping.end()) {
                if (cur.start <= cur.end)
                    return {cur};
            }
        }

        while (true) {
            assert(cur.start <= it->first.start);
            if (cur.start != it->first.start && cur.start < it->first.start) {
                assert(it->first.start != 0 && "Underflow");
                ret.push_back(IntervalT{cur.start, it->first.start - 1});
            }
            // does the rest of the interval covers all?
            if (it->first.end >= I.end)
                break;

            assert(it->first.end != (~static_cast<IntervalValueT>(0)) &&
                   "Overflow");
            cur.start = it->first.end + 1;
            assert(cur.end == I.end);

            ++it;
            if (it == end()) {
                if (cur.start <= cur.end)
                    ret.push_back(cur);
                // we're done here
                break;
            }
        }

        return ret;
    }